

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.cxx
# Opt level: O0

string * cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                   (string *__return_storage_ptr__,string *globalGenerator,string *extraGenerator)

{
  ulong uVar1;
  cmAlphaNum local_b8;
  cmAlphaNum local_78;
  string local_48;
  undefined1 local_21;
  string *local_20;
  string *extraGenerator_local;
  string *globalGenerator_local;
  string *fullName;
  
  local_21 = 0;
  local_20 = extraGenerator;
  extraGenerator_local = globalGenerator;
  globalGenerator_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_78,local_20);
      cmAlphaNum::cmAlphaNum(&local_b8," - ");
      cmStrCat<>(&local_48,&local_78,&local_b8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)extraGenerator_local);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
  const std::string& globalGenerator, const std::string& extraGenerator)
{
  std::string fullName;
  if (!globalGenerator.empty()) {
    if (!extraGenerator.empty()) {
      fullName = cmStrCat(extraGenerator, " - ");
    }
    fullName += globalGenerator;
  }
  return fullName;
}